

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboDepthbufferTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::DepthWriteClampCase::render(DepthWriteClampCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  int width;
  int height;
  int i;
  deUint32 program;
  TextureFormat texFormat;
  TransferFormat TVar1;
  Context *pCVar2;
  long lVar3;
  deUint32 depthTexture;
  deUint32 colorRbo;
  deUint32 fbo;
  float clearDepth;
  Vec4 local_1e8;
  TextureFormat local_1d8;
  Vec4 local_1d0;
  Vec4 red;
  Vec4 green;
  DepthGradientShader depthGradShader;
  
  fbo = 0;
  colorRbo = 0;
  depthTexture = 0;
  texFormat = glu::mapGLInternalFormat(this->m_format);
  TVar1 = glu::getTransferFormat(texFormat);
  FboTestUtil::DepthGradientShader::DepthGradientShader(&depthGradShader,TYPE_FLOAT_VEC4);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar2->_vptr_Context[0x75])(pCVar2,&depthGradShader);
  clearDepth = 1.0;
  red.m_data[0] = 1.0;
  red.m_data[1] = 0.0;
  red.m_data[2] = 0.0;
  red.m_data[3] = 1.0;
  green.m_data[0] = 0.0;
  green.m_data[1] = 1.0;
  green.m_data[2] = 0.0;
  green.m_data[3] = 1.0;
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&colorRbo);
  sglr::ContextWrapper::glGenTextures(this_00,1,&depthTexture);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,colorRbo);
  sglr::ContextWrapper::glRenderbufferStorage(this_00,0x8d41,0x8058,this->m_width,this->m_height);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,depthTexture);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,this->m_format,this->m_width,this->m_height,0,TVar1.format,
             TVar1.dataType,(void *)0x0);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,colorRbo);
  sglr::ContextWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8d00,0xde1,depthTexture,0);
  FboTestCase::checkError(&this->super_FboTestCase);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glViewport(this_00,0,0,this->m_width,this->m_height);
  sglr::ContextWrapper::glClearBufferfv(this_00,0x1801,0,&clearDepth);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glDepthFunc(this_00,0x207);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::DepthGradientShader::setUniforms(&depthGradShader,pCVar2,program,-1.0,2.0,&green);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1d0.m_data[0] = -1.0;
  local_1d0.m_data[1] = -1.0;
  local_1d0.m_data[2] = -1.0;
  local_1e8.m_data._0_8_ = &DAT_3f8000003f800000;
  local_1e8.m_data[2] = 1.0;
  sglr::drawQuad(pCVar2,program,(Vec3 *)&local_1d0,(Vec3 *)&local_1e8);
  sglr::ContextWrapper::glDepthMask(this_00,0);
  sglr::ContextWrapper::glDepthFunc(this_00,0x201);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::DepthGradientShader::setUniforms(&depthGradShader,pCVar2,program,1.0,1.0,&red);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1d0.m_data[0] = -1.0;
  local_1d0.m_data[1] = -1.0;
  local_1d0.m_data[2] = -1.0;
  local_1e8.m_data._0_8_ = &DAT_3f8000003f800000;
  local_1e8.m_data[2] = 1.0;
  sglr::drawQuad(pCVar2,program,(Vec3 *)&local_1d0,(Vec3 *)&local_1e8);
  sglr::ContextWrapper::glDepthFunc(this_00,0x204);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::DepthGradientShader::setUniforms(&depthGradShader,pCVar2,program,0.0,0.0,&red);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1d0.m_data[0] = -1.0;
  local_1d0.m_data[1] = -1.0;
  local_1d0.m_data[2] = -1.0;
  local_1e8.m_data._0_8_ = &DAT_3f8000003f800000;
  local_1e8.m_data[2] = 1.0;
  sglr::drawQuad(pCVar2,program,(Vec3 *)&local_1d0,(Vec3 *)&local_1e8);
  width = this->m_width;
  height = this->m_height;
  local_1d8 = glu::mapGLInternalFormat(0x8058);
  lVar3 = 0;
  do {
    local_1d0.m_data[lVar3] = 1.0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_1e8.m_data[0] = 0.0;
  local_1e8.m_data[1] = 0.0;
  local_1e8.m_data[2] = 0.0;
  local_1e8.m_data[3] = 0.0;
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst,0,0,width,height,&local_1d8,&local_1d0,&local_1e8);
  sglr::ShaderProgram::~ShaderProgram(&depthGradShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const deUint32			colorFormat			= GL_RGBA8;
		deUint32				fbo					= 0;
		deUint32				colorRbo			= 0;
		deUint32				depthTexture		= 0;
		glu::TransferFormat		transferFmt			= glu::getTransferFormat(glu::mapGLInternalFormat(m_format));

		DepthGradientShader		depthGradShader		(glu::TYPE_FLOAT_VEC4);
		const deUint32			depthGradShaderID	= getCurrentContext()->createProgram(&depthGradShader);
		const float				clearDepth			= 1.0f;
		const tcu::Vec4			red					(1.0, 0.0, 0.0, 1.0);
		const tcu::Vec4			green				(0.0, 1.0, 0.0, 1.0);

		// Setup FBO

		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &colorRbo);
		glGenTextures(1, &depthTexture);

		glBindRenderbuffer(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorage(GL_RENDERBUFFER, colorFormat, m_width, m_height);

		glBindTexture(GL_TEXTURE_2D, depthTexture);
		glTexImage2D(GL_TEXTURE_2D, 0, m_format, m_width, m_height, 0, transferFmt.format, transferFmt.dataType, DE_NULL);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, depthTexture, 0);
		checkError();
		checkFramebufferStatus(GL_FRAMEBUFFER);

		glViewport(0, 0, m_width, m_height);

		// Clear depth to 1
		glClearBufferfv(GL_DEPTH, 0, &clearDepth);

		// Test that invalid values are not written to the depth buffer

		// Render green quad, depth gradient = [-1..2]
		glEnable(GL_DEPTH_TEST);
		glDepthFunc(GL_ALWAYS);

		depthGradShader.setUniforms(*getCurrentContext(), depthGradShaderID, -1.0f, 2.0f, green);
		sglr::drawQuad(*getCurrentContext(), depthGradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));
		glDepthMask(GL_FALSE);

		// Test if any fragment has greater depth than 1; there should be none
		glDepthFunc(GL_LESS); // (1 < depth) ?
		depthGradShader.setUniforms(*getCurrentContext(), depthGradShaderID, 1.0f, 1.0f, red);
		sglr::drawQuad(*getCurrentContext(), depthGradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Test if any fragment has smaller depth than 0; there should be none
		glDepthFunc(GL_GREATER); // (0 > depth) ?
		depthGradShader.setUniforms(*getCurrentContext(), depthGradShaderID, 0.0f, 0.0f, red);
		sglr::drawQuad(*getCurrentContext(), depthGradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Read results.
		readPixels(dst, 0, 0, m_width, m_height, glu::mapGLInternalFormat(colorFormat), Vec4(1.0f), Vec4(0.0f));
	}